

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O2

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  undefined8 uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  if (tcp == (uv_stream_t *)0x0) {
    pcVar3 = "!=";
    pcVar5 = "!=";
    uVar6 = 0;
    nread = 0;
    pcVar4 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "tcp";
    uVar1 = 0x55;
LAB_001909b2:
    fprintf(_stderr,__format,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,uVar1,pcVar2,pcVar3,pcVar4,nread,pcVar5,uVar6);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      pcVar3 = "==";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      pcVar2 = "nread";
      uVar1 = 0x5b;
      uVar6 = 0xfffffffffffff001;
      pcVar5 = "==";
      pcVar4 = "UV_EOF";
      goto LAB_001909b2;
    }
    puts("GOT EOF");
    uv_close((uv_handle_t *)tcp,close_cb);
  }
  else {
    bytes_received_done = bytes_received_done + nread;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  /* The server will not send anything, it should close gracefully. */

  if (buf->base) {
    free(buf->base);
  }

  if (nread >= 0) {
    ASSERT_OK(nread);
  } else {
    ASSERT_NOT_NULL(tcp);
    ASSERT_EQ(nread, UV_EOF);
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}